

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

int __thiscall
libtorrent::aux::piece_picker::add_blocks
          (piece_picker *this,piece_index_t piece,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *pieces,vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                  *interesting_blocks,
          vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *backup_blocks,
          int num_blocks,int prefer_contiguous_blocks,torrent_peer *peer,
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          *ignore,picker_options_t options)

{
  piece_index_t index;
  piece_picker *ppVar1;
  bool bVar2;
  download_queue_t dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  iterator dp;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar7;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar8;
  piece_index_t k;
  int local_54;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  local_50;
  piece_picker *local_48;
  piece_index_t piece_local;
  
  piece_local = piece;
  bVar2 = ::(anonymous_namespace)::
          contains<std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                    (ignore,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)piece.m_val
                    );
  if (!bVar2) {
    local_50 = (index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                )pieces;
    local_48 = this;
    dVar3 = piece_pos::download_queue
                      ((this->m_piece_map).
                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       .
                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       ._M_impl.super__Vector_impl_data._M_start + piece.m_val);
    ppVar1 = local_48;
    if (dVar3.m_val == '\x04') {
      iVar4 = blocks_in_piece(local_48,piece);
      iVar5 = pad_bytes_in_piece(ppVar1,piece);
      if (prefer_contiguous_blocks == 0) {
        iVar6 = 0x4000;
        if (ppVar1->m_piece_size < 0x4000) {
          iVar6 = ppVar1->m_piece_size;
        }
        iVar4 = iVar4 - iVar5 / iVar6;
        if (num_blocks <= iVar4) {
          iVar4 = num_blocks;
        }
        for (k.m_val = 0; k.m_val < iVar4; k.m_val = k.m_val + 1) {
          ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
          emplace_back<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>&,int&>
                    ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *)
                     interesting_blocks,&piece_local,&k.m_val);
        }
        num_blocks = num_blocks - iVar4;
      }
      else {
        iVar7 = expand_piece(ppVar1,piece,prefer_contiguous_blocks,
                             (typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                              *)local_50,options);
        iVar8 = iVar7;
        while (k.m_val = (int)iVar8._begin.m_val, k.m_val != iVar7._end.m_val.m_val) {
          bVar2 = ::(anonymous_namespace)::
                  contains<std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                            (ignore,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
                                    k.m_val);
          if (bVar2) {
            prefer_contiguous_blocks = prefer_contiguous_blocks + -1;
            if ((prefer_contiguous_blocks == 0) && (num_blocks < 1)) break;
          }
          else {
            local_50 = iVar8;
            ::std::
            vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            ::push_back(ignore,&k);
            ppVar1 = local_48;
            index = k;
            iVar5 = blocks_in_piece(local_48,k);
            iVar6 = pad_bytes_in_piece(ppVar1,index);
            iVar4 = ppVar1->m_piece_size;
            if (0x3fff < iVar4) {
              iVar4 = 0x4000;
            }
            for (local_54 = 0; iVar8 = local_50, local_54 < iVar5 - iVar6 / iVar4;
                local_54 = local_54 + 1) {
              ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
              emplace_back<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,int&>
                        ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *)
                         interesting_blocks,&k,&local_54);
              if ((prefer_contiguous_blocks == 1) && (num_blocks < 2)) {
                num_blocks = num_blocks + -1;
                prefer_contiguous_blocks = 0;
                iVar8 = local_50;
                break;
              }
              num_blocks = num_blocks + -1;
              prefer_contiguous_blocks = prefer_contiguous_blocks + -1;
            }
          }
          iVar8._begin.m_val = iVar8._begin.m_val.m_val + 1;
          iVar8._end.m_val = 0;
        }
      }
      if (num_blocks < 1) {
        num_blocks = 0;
      }
    }
    else if ((dVar3.m_val == '\0') && ((options.m_val & 8) == 0)) {
      dp = find_dl_piece(local_48,(download_queue_t)0x0,piece);
      num_blocks = add_blocks_downloading
                             (ppVar1,dp._M_current,
                              (typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                               *)local_50,interesting_blocks,backup_blocks,num_blocks,
                              prefer_contiguous_blocks,peer,options);
    }
  }
  return num_blocks;
}

Assistant:

int piece_picker::add_blocks(piece_index_t piece
		, typed_bitfield<piece_index_t> const& pieces
		, std::vector<piece_block>& interesting_blocks
		, std::vector<piece_block>& backup_blocks
		, int num_blocks, int prefer_contiguous_blocks
		, aux::torrent_peer* peer, std::vector<piece_index_t>& ignore
		, picker_options_t const options) const
	{
		TORRENT_ASSERT(is_piece_free(piece, pieces));

		// ignore pieces found in the ignore list
		if (contains(ignore, piece)) return num_blocks;

		auto const state = m_piece_map[piece].download_queue();
		if (state != piece_pos::piece_open
			&& state != piece_pos::piece_downloading)
			return num_blocks;

		TORRENT_ASSERT(m_piece_map[piece].priority(this) >= 0);
		if (state == piece_pos::piece_downloading)
		{
			// if we're prioritizing partials, we've already
			// looked through the downloading pieces
			if (options & prioritize_partials) return num_blocks;

			auto i = find_dl_piece(piece_pos::piece_downloading, piece);
			TORRENT_ASSERT(i != m_downloads[state].end());

			return add_blocks_downloading(*i, pieces
				, interesting_blocks, backup_blocks
				, num_blocks, prefer_contiguous_blocks, peer, options);
		}

		// pick a new piece
		int payload_blocks = blocks_in_piece(piece) - pad_bytes_in_piece(piece) / block_size();

		if (prefer_contiguous_blocks == 0)
		{
			if (payload_blocks > num_blocks)
				payload_blocks = num_blocks;
			TORRENT_ASSERT(is_piece_free(piece, pieces));
			for (int j = 0; j < payload_blocks; ++j)
			{
				TORRENT_ASSERT(j < blocks_in_piece(piece));
				interesting_blocks.emplace_back(piece, j);
			}
			num_blocks -= payload_blocks;
		}
		else
		{
			auto const range = expand_piece(piece, prefer_contiguous_blocks
				, pieces, options);
			for (piece_index_t const k : range)
			{
				if (contains(ignore, k))
				{
					--prefer_contiguous_blocks;
					if (prefer_contiguous_blocks == 0
						&& num_blocks <= 0) break;
					continue;
				}
				ignore.push_back(k);

				TORRENT_ASSERT(m_piece_map[k].priority(this) > 0);
				payload_blocks = blocks_in_piece(k) - pad_bytes_in_piece(k) / block_size();
				TORRENT_ASSERT(is_piece_free(k, pieces));
				for (int j = 0; j < payload_blocks; ++j)
				{
					TORRENT_ASSERT(j < blocks_in_piece(k));
					interesting_blocks.emplace_back(k, j);
					--num_blocks;
					--prefer_contiguous_blocks;
					if (prefer_contiguous_blocks == 0
						&& num_blocks <= 0) break;
				}
			}
		}
#if TORRENT_USE_INVARIANT_CHECKS
		verify_pick(interesting_blocks, pieces);
#endif
		return std::max(num_blocks, 0);
	}